

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.cpp
# Opt level: O0

int __thiscall anon_unknown.dwarf_253962::WaveBackend::mixerProc(WaveBackend *this)

{
  bool bVar1;
  ALuint AVar2;
  int iVar3;
  byte *__ptr;
  rep rVar4;
  long in_RDI;
  seconds s;
  size_t fs;
  int64_t avail;
  time_point now;
  time_point start;
  int64_t done;
  ALuint frameSize;
  size_t frameStep;
  ALuint in_stack_00000094;
  milliseconds restTime;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffff58;
  ALCdevice *in_stack_ffffffffffffff60;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 uVar5;
  long local_78;
  duration<long,_std::ratio<1L,_1L>_> in_stack_ffffffffffffff90;
  duration<long,_std::ratio<1L,_1L>_> local_50;
  rep local_48;
  undefined8 local_40;
  undefined8 local_38;
  long local_30;
  ALuint local_24;
  ulong local_20;
  uint local_14;
  duration<long,std::ratio<1l,1000l>> local_10 [16];
  
  local_14 = (uint)((ulong)(uint)(*(int *)(*(long *)(in_RDI + 8) + 0x10) * 1000) /
                    (ulong)*(uint *)(*(long *)(in_RDI + 8) + 0xc) >> 1);
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_int,void>(local_10,&local_14);
  althrd_setname("alsoft-mixer");
  AVar2 = ALCdevice::channelsFromFmt((ALCdevice *)0x24a978);
  local_20 = (ulong)AVar2;
  local_24 = ALCdevice::frameSizeFromFmt(in_stack_ffffffffffffff60);
  local_30 = 0;
  local_38 = std::chrono::_V2::steady_clock::now();
  do {
    while( true ) {
      bVar1 = std::atomic<bool>::load
                        ((atomic<bool> *)in_stack_ffffffffffffff68,
                         (memory_order)((ulong)in_stack_ffffffffffffff60 >> 0x20));
      uVar5 = false;
      if (!bVar1) {
        uVar5 = std::atomic<bool>::load
                          ((atomic<bool> *)in_stack_ffffffffffffff68,
                           (memory_order)((ulong)in_stack_ffffffffffffff60 >> 0x20));
      }
      if ((bool)uVar5 == false) {
        return 0;
      }
      local_40 = std::chrono::_V2::steady_clock::now();
      std::chrono::operator-
                (in_stack_ffffffffffffff68,
                 (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)in_stack_ffffffffffffff60);
      std::chrono::operator*(&in_stack_ffffffffffffff68->__d,(uint *)in_stack_ffffffffffffff60);
      local_50.__r = (rep)std::chrono::
                          duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                    (in_stack_ffffffffffffff58);
      local_48 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_50);
      if ((long)(ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x10) <= local_48 - local_30) break;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffff90.__r);
    }
    do {
      if (local_48 - local_30 < (long)(ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x10))
      goto LAB_0024ab83;
      in_stack_ffffffffffffff68 =
           *(time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             **)(in_RDI + 8);
      std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::data
                ((vector<al::byte,_al::allocator<al::byte,_1UL>_> *)0x24aab4);
      ALCdevice::renderSamples((ALCdevice *)this,(void *)restTime.__r,in_stack_00000094,frameStep);
      local_30 = (ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x10) + local_30;
      __ptr = std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::data
                        ((vector<al::byte,_al::allocator<al::byte,_1UL>_> *)0x24aaf4);
      fwrite(__ptr,(ulong)local_24,(ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x10),
             *(FILE **)(in_RDI + 0x10));
      iVar3 = ferror(*(FILE **)(in_RDI + 0x10));
    } while (iVar3 == 0);
    if (0 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Error writing to file\n");
    }
    ALCdevice::handleDisconnect(*(ALCdevice **)(in_RDI + 8),"Failed to write playback samples");
LAB_0024ab83:
    if ((long)(ulong)*(uint *)(*(long *)(in_RDI + 8) + 0xc) <= local_30) {
      local_78 = local_30 / (long)(ulong)*(uint *)(*(long *)(in_RDI + 8) + 0xc);
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>
                ((duration<long,std::ratio<1l,1l>> *)&stack0xffffffffffffff90,&local_78);
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                 CONCAT17(uVar5,in_stack_ffffffffffffff70),
                 (duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff68);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::operator+=((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      in_stack_ffffffffffffff60 = (ALCdevice *)(ulong)*(uint *)(*(long *)(in_RDI + 8) + 0xc);
      rVar4 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                        ((duration<long,_std::ratio<1L,_1L>_> *)&stack0xffffffffffffff90);
      local_30 = local_30 - (long)in_stack_ffffffffffffff60 * rVar4;
    }
  } while( true );
}

Assistant:

int WaveBackend::mixerProc()
{
    const milliseconds restTime{mDevice->UpdateSize*1000/mDevice->Frequency / 2};

    althrd_setname(MIXER_THREAD_NAME);

    const size_t frameStep{mDevice->channelsFromFmt()};
    const ALuint frameSize{mDevice->frameSizeFromFmt()};

    int64_t done{0};
    auto start = std::chrono::steady_clock::now();
    while(!mKillNow.load(std::memory_order_acquire) &&
          mDevice->Connected.load(std::memory_order_acquire))
    {
        auto now = std::chrono::steady_clock::now();

        /* This converts from nanoseconds to nanosamples, then to samples. */
        int64_t avail{std::chrono::duration_cast<seconds>((now-start) *
            mDevice->Frequency).count()};
        if(avail-done < mDevice->UpdateSize)
        {
            std::this_thread::sleep_for(restTime);
            continue;
        }
        while(avail-done >= mDevice->UpdateSize)
        {
            mDevice->renderSamples(mBuffer.data(), mDevice->UpdateSize, frameStep);
            done += mDevice->UpdateSize;

            if /*constexpr*/(!IS_LITTLE_ENDIAN)
            {
                const ALuint bytesize{mDevice->bytesFromFmt()};

                if(bytesize == 2)
                {
                    ALushort *samples = reinterpret_cast<ALushort*>(mBuffer.data());
                    const size_t len{mBuffer.size() / 2};
                    for(size_t i{0};i < len;i++)
                    {
                        const ALushort samp{samples[i]};
                        samples[i] = static_cast<ALushort>((samp>>8) | (samp<<8));
                    }
                }
                else if(bytesize == 4)
                {
                    ALuint *samples = reinterpret_cast<ALuint*>(mBuffer.data());
                    const size_t len{mBuffer.size() / 4};
                    for(size_t i{0};i < len;i++)
                    {
                        const ALuint samp{samples[i]};
                        samples[i] = (samp>>24) | ((samp>>8)&0x0000ff00) |
                                     ((samp<<8)&0x00ff0000) | (samp<<24);
                    }
                }
            }

            size_t fs{fwrite(mBuffer.data(), frameSize, mDevice->UpdateSize, mFile)};
            (void)fs;
            if(ferror(mFile))
            {
                ERR("Error writing to file\n");
                mDevice->handleDisconnect("Failed to write playback samples");
                break;
            }
        }

        /* For every completed second, increment the start time and reduce the
         * samples done. This prevents the difference between the start time
         * and current time from growing too large, while maintaining the
         * correct number of samples to render.
         */
        if(done >= mDevice->Frequency)
        {
            seconds s{done/mDevice->Frequency};
            start += s;
            done -= mDevice->Frequency*s.count();
        }
    }

    return 0;
}